

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O3

void aom_hadamard_32x32_avx2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  uint uVar6;
  long lVar7;
  int16_t *src_diff_00;
  long lVar8;
  undefined1 *puVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int16_t temp_coeff_1 [256];
  int16_t temp_coeff [1024];
  int16_t local_a60 [64];
  undefined1 auStack_9e0 [128];
  int16_t local_960 [64];
  undefined1 auStack_8e0 [128];
  undefined1 local_860 [512];
  undefined1 auStack_660 [512];
  undefined1 auStack_460 [512];
  undefined1 auStack_260 [560];
  
  puVar9 = local_860;
  lVar8 = 0;
  do {
    src_diff_00 = (int16_t *)
                  ((long)src_diff +
                  (ulong)(((uint)lVar8 & 1) << 5) + (ulong)((uint)lVar8 * 8 & 0x10) * src_stride * 2
                  );
    aom_hadamard_lp_8x8_dual_avx2(src_diff_00,src_stride,local_a60);
    aom_hadamard_lp_8x8_dual_avx2(src_diff_00 + src_stride * 8,src_stride,local_960);
    lVar7 = 0;
    do {
      auVar15 = vpaddw_avx2(*(undefined1 (*) [32])(auStack_9e0 + lVar7 * 2),
                            *(undefined1 (*) [32])(local_a60 + lVar7));
      auVar10 = vpsubw_avx2(*(undefined1 (*) [32])(local_a60 + lVar7),
                            *(undefined1 (*) [32])(auStack_9e0 + lVar7 * 2));
      auVar11 = vpaddw_avx2(*(undefined1 (*) [32])(auStack_8e0 + lVar7 * 2),
                            *(undefined1 (*) [32])(local_960 + lVar7));
      auVar12 = vpsubw_avx2(*(undefined1 (*) [32])(local_960 + lVar7),
                            *(undefined1 (*) [32])(auStack_8e0 + lVar7 * 2));
      auVar13 = vpsraw_avx2(auVar15,1);
      auVar10 = vpsraw_avx2(auVar10,1);
      auVar11 = vpsraw_avx2(auVar11,1);
      auVar12 = vpsraw_avx2(auVar12,1);
      auVar15 = vpaddw_avx2(auVar11,auVar13);
      *(undefined1 (*) [32])(puVar9 + lVar7 * 2) = auVar15;
      auVar15 = vpaddw_avx2(auVar12,auVar10);
      *(undefined1 (*) [32])(puVar9 + lVar7 * 2 + 0x80) = auVar15;
      auVar15 = vpsubw_avx2(auVar13,auVar11);
      *(undefined1 (*) [32])(puVar9 + lVar7 * 2 + 0x100) = auVar15;
      auVar15 = vpsubw_avx2(auVar10,auVar12);
      *(undefined1 (*) [32])(puVar9 + lVar7 * 2 + 0x180) = auVar15;
      uVar6 = (uint)lVar7;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < 0x30);
    lVar8 = lVar8 + 1;
    puVar9 = puVar9 + 0x200;
  } while (lVar8 != 4);
  lVar8 = 0;
  do {
    auVar15 = *(undefined1 (*) [32])(local_860 + lVar8 * 2);
    auVar11 = *(undefined1 (*) [32])(auStack_660 + lVar8 * 2);
    auVar10 = *(undefined1 (*) [32])(auStack_460 + lVar8 * 2);
    auVar12 = *(undefined1 (*) [32])(auStack_260 + lVar8 * 2);
    auVar14 = vpsraw_avx2(auVar15,0xf);
    auVar13 = vpunpcklwd_avx2(auVar15,auVar14);
    auVar14 = vpunpckhwd_avx2(auVar15,auVar14);
    auVar15 = vpsraw_avx2(auVar11,0xf);
    auVar3 = vpunpcklwd_avx2(auVar11,auVar15);
    auVar16 = vpunpckhwd_avx2(auVar11,auVar15);
    auVar15 = vpsraw_avx2(auVar10,0xf);
    auVar4 = vpunpcklwd_avx2(auVar10,auVar15);
    auVar1 = vpunpckhwd_avx2(auVar10,auVar15);
    auVar15 = vpsraw_avx2(auVar12,0xf);
    auVar5 = vpunpcklwd_avx2(auVar12,auVar15);
    auVar2 = vpunpckhwd_avx2(auVar12,auVar15);
    auVar15 = vpaddd_avx2(auVar3,auVar13);
    auVar11 = vpaddd_avx2(auVar16,auVar14);
    auVar13 = vpsubd_avx2(auVar13,auVar3);
    auVar14 = vpsubd_avx2(auVar14,auVar16);
    auVar10 = vpaddd_avx2(auVar5,auVar4);
    auVar12 = vpaddd_avx2(auVar2,auVar1);
    auVar16 = vpsubd_avx2(auVar4,auVar5);
    auVar1 = vpsubd_avx2(auVar1,auVar2);
    auVar15 = vpsrad_avx2(auVar15,2);
    auVar13 = vpsrad_avx2(auVar13,2);
    auVar10 = vpsrad_avx2(auVar10,2);
    auVar16 = vpsrad_avx2(auVar16,2);
    auVar11 = vpsrad_avx2(auVar11,2);
    auVar15 = vpackssdw_avx2(auVar15,auVar11);
    auVar11 = vpsrad_avx2(auVar14,2);
    auVar11 = vpackssdw_avx2(auVar13,auVar11);
    auVar12 = vpsrad_avx2(auVar12,2);
    auVar10 = vpackssdw_avx2(auVar10,auVar12);
    auVar12 = vpsrad_avx2(auVar1,2);
    auVar12 = vpackssdw_avx2(auVar16,auVar12);
    auVar13 = vpaddw_avx2(auVar10,auVar15);
    auVar16 = vpsraw_avx2(auVar13,0xf);
    auVar14 = vpunpcklwd_avx2(auVar13,auVar16);
    auVar13 = vpunpckhwd_avx2(auVar13,auVar16);
    *(undefined1 (*) [32])(coeff + lVar8) = auVar14;
    *(undefined1 (*) [32])(coeff + lVar8 + 8) = auVar13;
    auVar13 = vpaddw_avx2(auVar12,auVar11);
    auVar16 = vpsraw_avx2(auVar13,0xf);
    auVar14 = vpunpcklwd_avx2(auVar13,auVar16);
    auVar13 = vpunpckhwd_avx2(auVar13,auVar16);
    *(undefined1 (*) [32])(coeff + lVar8 + 0x100) = auVar14;
    *(undefined1 (*) [32])(coeff + lVar8 + 0x108) = auVar13;
    auVar15 = vpsubw_avx2(auVar15,auVar10);
    auVar13 = vpsraw_avx2(auVar15,0xf);
    auVar10 = vpunpcklwd_avx2(auVar15,auVar13);
    auVar15 = vpunpckhwd_avx2(auVar15,auVar13);
    *(undefined1 (*) [32])(coeff + lVar8 + 0x200) = auVar10;
    *(undefined1 (*) [32])(coeff + lVar8 + 0x208) = auVar15;
    auVar15 = vpsubw_avx2(auVar11,auVar12);
    auVar10 = vpsraw_avx2(auVar15,0xf);
    auVar11 = vpunpcklwd_avx2(auVar15,auVar10);
    auVar15 = vpunpckhwd_avx2(auVar15,auVar10);
    *(undefined1 (*) [32])(coeff + lVar8 + 0x300) = auVar11;
    *(undefined1 (*) [32])(coeff + lVar8 + 0x308) = auVar15;
    uVar6 = (uint)lVar8;
    lVar8 = lVar8 + 0x10;
  } while (uVar6 < 0xf0);
  return;
}

Assistant:

void aom_hadamard_32x32_avx2(const int16_t *src_diff, ptrdiff_t src_stride,
                             tran_low_t *coeff) {
  // For high bitdepths, it is unnecessary to store_tran_low
  // (mult/unpack/store), then load_tran_low (load/pack) the same memory in the
  // next stage.  Output to an intermediate buffer first, then store_tran_low()
  // in the final stage.
  DECLARE_ALIGNED(32, int16_t, temp_coeff[32 * 32]);
  int16_t *t_coeff = temp_coeff;
  int idx;
  __m256i coeff0_lo, coeff1_lo, coeff2_lo, coeff3_lo, b0_lo, b1_lo, b2_lo,
      b3_lo;
  __m256i coeff0_hi, coeff1_hi, coeff2_hi, coeff3_hi, b0_hi, b1_hi, b2_hi,
      b3_hi;
  __m256i b0, b1, b2, b3;
  const __m256i zero = _mm256_setzero_si256();
  for (idx = 0; idx < 4; ++idx) {
    // src_diff: 9 bit, dynamic range [-255, 255]
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 16 * src_stride + (idx & 0x01) * 16;
    hadamard_16x16_avx2(src_ptr, src_stride,
                        (tran_low_t *)(t_coeff + idx * 256), 0);
  }

  for (idx = 0; idx < 256; idx += 16) {
    const __m256i coeff0 = _mm256_loadu_si256((const __m256i *)t_coeff);
    const __m256i coeff1 = _mm256_loadu_si256((const __m256i *)(t_coeff + 256));
    const __m256i coeff2 = _mm256_loadu_si256((const __m256i *)(t_coeff + 512));
    const __m256i coeff3 = _mm256_loadu_si256((const __m256i *)(t_coeff + 768));

    // Sign extend 16 bit to 32 bit.
    sign_extend_16bit_to_32bit_avx2(coeff0, zero, &coeff0_lo, &coeff0_hi);
    sign_extend_16bit_to_32bit_avx2(coeff1, zero, &coeff1_lo, &coeff1_hi);
    sign_extend_16bit_to_32bit_avx2(coeff2, zero, &coeff2_lo, &coeff2_hi);
    sign_extend_16bit_to_32bit_avx2(coeff3, zero, &coeff3_lo, &coeff3_hi);

    b0_lo = _mm256_add_epi32(coeff0_lo, coeff1_lo);
    b0_hi = _mm256_add_epi32(coeff0_hi, coeff1_hi);

    b1_lo = _mm256_sub_epi32(coeff0_lo, coeff1_lo);
    b1_hi = _mm256_sub_epi32(coeff0_hi, coeff1_hi);

    b2_lo = _mm256_add_epi32(coeff2_lo, coeff3_lo);
    b2_hi = _mm256_add_epi32(coeff2_hi, coeff3_hi);

    b3_lo = _mm256_sub_epi32(coeff2_lo, coeff3_lo);
    b3_hi = _mm256_sub_epi32(coeff2_hi, coeff3_hi);

    b0_lo = _mm256_srai_epi32(b0_lo, 2);
    b1_lo = _mm256_srai_epi32(b1_lo, 2);
    b2_lo = _mm256_srai_epi32(b2_lo, 2);
    b3_lo = _mm256_srai_epi32(b3_lo, 2);

    b0_hi = _mm256_srai_epi32(b0_hi, 2);
    b1_hi = _mm256_srai_epi32(b1_hi, 2);
    b2_hi = _mm256_srai_epi32(b2_hi, 2);
    b3_hi = _mm256_srai_epi32(b3_hi, 2);

    b0 = _mm256_packs_epi32(b0_lo, b0_hi);
    b1 = _mm256_packs_epi32(b1_lo, b1_hi);
    b2 = _mm256_packs_epi32(b2_lo, b2_hi);
    b3 = _mm256_packs_epi32(b3_lo, b3_hi);

    store_tran_low(_mm256_add_epi16(b0, b2), coeff);
    store_tran_low(_mm256_add_epi16(b1, b3), coeff + 256);
    store_tran_low(_mm256_sub_epi16(b0, b2), coeff + 512);
    store_tran_low(_mm256_sub_epi16(b1, b3), coeff + 768);

    coeff += 16;
    t_coeff += 16;
  }
}